

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O3

_Bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *context)

{
  byte *pbVar1;
  _Bool _Var2;
  wchar_t wVar3;
  monster_conflict *pmVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  char *fmt;
  char m_name [80];
  char m_poss [80];
  char acStack_c8 [80];
  char local_78 [88];
  
  if ((context->origin).what == SRC_MONSTER) {
    wVar3 = (context->origin).which.monster;
    if (L'\0' < wVar3) {
      pmVar4 = (monster_conflict *)cave_monster(cave,wVar3);
      if (pmVar4 != (monster_conflict *)0x0) {
        wVar3 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
        pmVar4 = choose_nearby_injured_kin((chunk *)cave,pmVar4);
        if (pmVar4 != (monster_conflict *)0x0) {
          monster_desc(acStack_c8,0x50,(monster *)pmVar4,L'̔');
          monster_desc(local_78,0x50,(monster *)pmVar4,L'\"');
          if (player->timed[2] == 0) {
            _Var2 = monster_is_visible((monster *)pmVar4);
            iVar7 = wVar3 + pmVar4->hp;
            sVar5 = pmVar4->maxhp;
            sVar6 = (short)iVar7;
            if (sVar5 < iVar7) {
              sVar6 = sVar5;
            }
            pmVar4->hp = sVar6;
            if (_Var2) {
              if (sVar6 == sVar5) {
                fmt = "%s looks REALLY healthy!";
              }
              else {
                fmt = "%s looks healthier.";
              }
              msg(fmt,acStack_c8);
            }
          }
          else {
            iVar7 = wVar3 + pmVar4->hp;
            sVar5 = (short)iVar7;
            if (pmVar4->maxhp < iVar7) {
              sVar5 = pmVar4->maxhp;
            }
            pmVar4->hp = sVar5;
          }
          if ((monster_conflict *)player->upkeep->health_who == pmVar4) {
            pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
            *pbVar1 = *pbVar1 | 2;
          }
          if (pmVar4->m_timed[3] != 0) {
            mon_clear_timed((monster *)pmVar4,L'\x03',L'\x04');
            msg("%s recovers %s courage.",acStack_c8,local_78);
          }
          context->ident = true;
        }
      }
    }
    return true;
  }
  __assert_fail("context->origin.what == SRC_MONSTER",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-attack.c"
                ,0x139,"_Bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *)");
}

Assistant:

bool effect_handler_MON_HEAL_KIN(effect_handler_context_t *context)
{
	assert(context->origin.what == SRC_MONSTER);

	int midx = context->origin.which.monster;
	struct monster *mon = midx > 0 ? cave_monster(cave, midx) : NULL;
	if (!mon) return true;

	int amount = effect_calculate_value(context, false);
	char m_name[80], m_poss[80];
	bool seen;

	/* Find a nearby monster */
	mon = choose_nearby_injured_kin(cave, mon);
	if (!mon) return true;

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the monster possessive ("his"/"her"/"its") */
	monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

	seen = (!player->timed[TMD_BLIND] && monster_is_visible(mon));

	/* Heal some */
	mon->hp = MIN(mon->hp + amount, mon->maxhp);

	if (seen) {
		if (mon->hp == mon->maxhp) {
			msg("%s looks REALLY healthy!", m_name);
		} else if (seen) { /* Partially healed */
			msg("%s looks healthier.", m_name);
		}
	}

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Cancel fear */
	if (mon->m_timed[MON_TMD_FEAR]) {
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		msg("%s recovers %s courage.", m_name, m_poss);
	}

	/* ID */
	context->ident = true;

	return true;
}